

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,true>
               (uchar *ldata,uchar *rdata,uchar *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  uchar uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar1 = *rdata;
      iVar6 = 0;
      do {
        result_data[iVar6] = uVar1 * ldata[iVar6];
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = 0;
    uVar9 = 0;
    do {
      uVar3 = puVar2[uVar7];
      uVar4 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar4 = count;
      }
      uVar5 = uVar4;
      if (uVar3 != 0) {
        uVar5 = uVar9;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar9 < uVar4) {
            uVar1 = *rdata;
            do {
              result_data[uVar9] = uVar1 * ldata[uVar9];
              uVar9 = uVar9 + 1;
              uVar5 = uVar4;
            } while (uVar4 != uVar9);
          }
        }
        else if (uVar9 < uVar4) {
          uVar8 = 0;
          do {
            if ((uVar3 >> (uVar8 & 0x3f) & 1) != 0) {
              result_data[uVar8 + uVar9] = *rdata * ldata[uVar8 + uVar9];
            }
            uVar8 = uVar8 + 1;
            uVar5 = uVar4;
          } while (uVar4 - uVar9 != uVar8);
        }
      }
      uVar7 = uVar7 + 1;
      uVar9 = uVar5;
    } while (uVar7 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}